

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O1

int __thiscall
CVmObjLookupTable::getp_count_entries
          (CVmObjLookupTable *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  int iVar1;
  uint uVar2;
  vm_obj_id_t vVar3;
  uint *puVar4;
  
  if (getp_count_entries(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    getp_count_entries();
  }
  iVar1 = CVmObject::get_prop_check_argc(retval,argc,&getp_count_entries::desc);
  if (iVar1 == 0) {
    puVar4 = (uint *)(this->super_CVmObjCollection).super_CVmObject.ext_;
    uVar2 = puVar4[1];
    if (uVar2 == 0) {
      vVar3 = 0;
    }
    else {
      puVar4 = puVar4 + (ulong)*puVar4 * 2 + 8;
      vVar3 = 0;
      do {
        vVar3 = vVar3 + (*puVar4 != 0xd);
        puVar4 = puVar4 + 10;
        uVar2 = uVar2 - 1;
      } while (uVar2 != 0);
    }
    retval->typ = VM_INT;
    (retval->val).obj = vVar3;
  }
  return 1;
}

Assistant:

int CVmObjLookupTable::getp_count_entries(VMG_ vm_obj_id_t self,
                                          vm_val_t *retval, uint *argc)
{
    static CVmNativeCodeDesc desc(0);
    uint i;
    int cnt;
    vm_lookup_val *entry;
    
    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* run through the table and count in-use entries */
    for (cnt = 0, i = get_entry_count(), entry = get_ext()->idx_to_val(0) ;
         i != 0 ; --i, ++entry)
    {
        /* if the entry is not marked as free, count it as used */
        if (entry->key.typ != VM_EMPTY)
            ++cnt;
    }

    /* return the number of in-use entries we counted */
    retval->set_int(cnt);

    /* handled */
    return TRUE;
}